

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  archive_string_conv *paVar3;
  bool local_37;
  bool local_36;
  bool local_35;
  wchar_t local_34;
  wchar_t ret;
  tar *tar;
  char *val_local;
  char *key_local;
  archive_read *a_local;
  
  local_34 = L'\xffffffe7';
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"compat-2x");
  if (iVar2 == 0) {
    local_35 = false;
    if (val != (char *)0x0) {
      local_35 = *val != '\0';
    }
    *(uint *)((long)pvVar1 + 0x1ac) = (uint)local_35;
    *(undefined4 *)((long)pvVar1 + 0x1a8) = *(undefined4 *)((long)pvVar1 + 0x1ac);
    a_local._4_4_ = L'\0';
  }
  else {
    iVar2 = strcmp(key,"hdrcharset");
    if (iVar2 == 0) {
      if ((val == (char *)0x0) || (*val == '\0')) {
        archive_set_error(&a->archive,-1,"tar: hdrcharset option needs a character-set name");
      }
      else {
        paVar3 = archive_string_conversion_from_charset(&a->archive,val,L'\0');
        *(archive_string_conv **)((long)pvVar1 + 0x188) = paVar3;
        if (*(long *)((long)pvVar1 + 0x188) == 0) {
          local_34 = L'\xffffffe2';
        }
        else {
          local_34 = L'\0';
        }
      }
      a_local._4_4_ = local_34;
    }
    else {
      iVar2 = strcmp(key,"mac-ext");
      if (iVar2 == 0) {
        local_36 = false;
        if (val != (char *)0x0) {
          local_36 = *val != '\0';
        }
        *(uint *)((long)pvVar1 + 0x1b0) = (uint)local_36;
        a_local._4_4_ = L'\0';
      }
      else {
        iVar2 = strcmp(key,"read_concatenated_archives");
        if (iVar2 == 0) {
          local_37 = false;
          if (val != (char *)0x0) {
            local_37 = *val != '\0';
          }
          *(uint *)((long)pvVar1 + 0x1b4) = (uint)local_37;
          a_local._4_4_ = L'\0';
        }
        else {
          a_local._4_4_ = L'\xffffffec';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_tar_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct tar *tar;
	int ret = ARCHIVE_FAILED;

	tar = (struct tar *)(a->format->data);
	if (strcmp(key, "compat-2x")  == 0) {
		/* Handle UTF-8 filenames as libarchive 2.x */
		tar->compat_2x = (val != NULL && val[0] != 0);
		tar->init_default_conversion = tar->compat_2x;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "tar: hdrcharset option needs a character-set name");
		else {
			tar->opt_sconv =
			    archive_string_conversion_from_charset(
				&a->archive, val, 0);
			if (tar->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "mac-ext") == 0) {
		tar->process_mac_extensions = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	} else if (strcmp(key, "read_concatenated_archives") == 0) {
		tar->read_concatenated_archives = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}